

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O1

void test_one<char>(locale *l,string *ia,string *ib,int diff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  collate *pcVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  string local_c0;
  string local_a0;
  string local_80;
  locale local_60 [8];
  locale local_58 [8];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  std::locale::locale(local_58,l);
  pcVar2 = (ia->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_80,pcVar2,pcVar2 + ia->_M_string_length,local_58,default_method);
  std::locale::~locale(local_58);
  std::locale::locale(local_60,l);
  pcVar2 = (ib->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_a0,pcVar2,pcVar2 + ib->_M_string_length,local_60,default_method);
  std::locale::~locale(local_60);
  if (diff < 0) {
    test_counter = test_counter + 1;
    pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
    iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                      (pcVar6,local_80._M_dataplus._M_p,
                       local_80._M_dataplus._M_p + local_80._M_string_length,
                       local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length);
    if (-1 < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," l(a,b)",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar4 = error_counter + 1;
      bVar3 = 0x14 < error_counter;
      error_counter = iVar4;
      if (bVar3) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar8,&local_c0);
        __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
    iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                      (pcVar6,local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length,
                       local_80._M_dataplus._M_p,
                       local_80._M_dataplus._M_p + local_80._M_string_length);
    if (iVar4 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !l(b,a)",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar4 = error_counter + 1;
      bVar3 = 0x14 < error_counter;
      error_counter = iVar4;
      if (bVar3) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar8,&local_c0);
        __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  else {
    test_counter = test_counter + 1;
    if (diff == 0) {
      pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
      iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                        (pcVar6,local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length,
                         local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length);
      if (iVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," !l(a,b)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar4 = error_counter + 1;
        bVar3 = 0x14 < error_counter;
        error_counter = iVar4;
        if (bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar8,&local_c0);
          __cxa_throw(prVar8,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
      iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                        (pcVar6,local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length,
                         local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length);
      if (iVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," !l(b,a)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar4 = error_counter + 1;
        bVar3 = 0x14 < error_counter;
        error_counter = iVar4;
        if (bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar8,&local_c0);
          __cxa_throw(prVar8,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
      iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                        (pcVar6,local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length,
                         local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length);
      if (iVar4 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x31);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," !l(a,b)",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar4 = error_counter + 1;
        bVar3 = 0x14 < error_counter;
        error_counter = iVar4;
        if (bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar8,&local_c0);
          __cxa_throw(prVar8,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
      iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                        (pcVar6,local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length,
                         local_80._M_dataplus._M_p,
                         local_80._M_dataplus._M_p + local_80._M_string_length);
      if (-1 < iVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x32);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," l(b,a)",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar4 = error_counter + 1;
        bVar3 = 0x14 < error_counter;
        error_counter = iVar4;
        if (bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar8,&local_c0);
          __cxa_throw(prVar8,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
  }
  pcVar6 = std::use_facet<std::__cxx11::collate<char>>(l);
  test_counter = test_counter + 1;
  iVar4 = (**(code **)(*(long *)pcVar6 + 0x10))
                    (pcVar6,local_80._M_dataplus._M_p,
                     local_80._M_dataplus._M_p + local_80._M_string_length,local_a0._M_dataplus._M_p
                     ,local_a0._M_dataplus._M_p + local_a0._M_string_length);
  if (iVar4 != diff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size())",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar3) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,&local_c0);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  (**(code **)(*(long *)pcVar6 + 0x18))
            (&local_c0,pcVar6,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  (**(code **)(*(long *)pcVar6 + 0x18))
            (&local_50,pcVar6,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  uVar9 = local_c0._M_string_length;
  if (local_48 < local_c0._M_string_length) {
    uVar9 = local_48;
  }
  if (uVar9 == 0) {
    uVar9 = 0;
  }
  else {
    uVar5 = memcmp(local_c0._M_dataplus._M_p,local_50,uVar9);
    uVar9 = (ulong)uVar5;
  }
  if ((int)uVar9 == 0) {
    uVar9 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_c0._M_string_length - local_48)) {
      uVar9 = local_c0._M_string_length - local_48;
    }
    if (0x7ffffffe < (long)uVar9) {
      uVar9 = 0x7fffffff;
    }
  }
  uVar5 = 0xffffffff;
  if (-1 < (int)uVar9) {
    uVar5 = (uint)((int)uVar9 != 0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (uVar5 != diff) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size())))"
               ,0x73);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar3 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar3) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,&local_c0);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (diff == 0) {
    test_counter = test_counter + 1;
    lVar10 = (**(code **)(*(long *)pcVar6 + 0x20))
                       (pcVar6,local_80._M_dataplus._M_p,
                        local_80._M_dataplus._M_p + local_80._M_string_length);
    lVar11 = (**(code **)(*(long *)pcVar6 + 0x20))
                       (pcVar6,local_a0._M_dataplus._M_p,
                        local_a0._M_dataplus._M_p + local_a0._M_string_length);
    if (lVar10 != lVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 " col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size())"
                 ,0x51);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar4 = error_counter + 1;
      bVar3 = 0x14 < error_counter;
      error_counter = iVar4;
      if (bVar3) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar8,&local_c0);
        __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string ia,std::string ib,int diff)
{
    std::basic_string<CharType> a=to_correct_string<CharType>(ia,l);
    std::basic_string<CharType> b=to_correct_string<CharType>(ib,l);
    if(diff < 0) {
        TEST(l(a,b));
        TEST(!l(b,a));
    }
    else if(diff == 0) {
        TEST(!l(a,b));
        TEST(!l(b,a));
    }
    else {
        TEST(!l(a,b));
        TEST(l(b,a));
    }
    
    std::collate<CharType> const &col = std::use_facet<std::collate<CharType> >(l);

    TEST(diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size()));
    TEST(diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size()))));
    if(diff == 0) {
        TEST(col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size()));
    }
}